

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Skip(CopyingInputStreamAdaptor *this,int count)

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  undefined1 *puVar4;
  bool bVar5;
  undefined1 local_20 [16];
  
  if (count < 0) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)count,0,"count >= 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    if (this->failed_ == false) {
      iVar1 = this->backup_bytes_;
      if (iVar1 < count) {
        this->backup_bytes_ = 0;
        uVar2 = (*this->copying_stream_->_vptr_CopyingInputStream[3])
                          (this->copying_stream_,(ulong)(uint)(count - iVar1));
        this->position_ = this->position_ + (long)(int)uVar2;
        bVar5 = uVar2 == count - iVar1;
      }
      else {
        this->backup_bytes_ = iVar1 - count;
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
    return bVar5;
  }
  puVar4 = local_20;
  Skip();
  return (bool)((char)*(undefined8 *)(puVar4 + 0x18) - (char)*(undefined4 *)(puVar4 + 0x30));
}

Assistant:

bool CopyingInputStreamAdaptor::Skip(int count) {
  ABSL_CHECK_GE(count, 0);

  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  // First skip any bytes left over from a previous BackUp().
  if (backup_bytes_ >= count) {
    // We have more data left over than we're trying to skip.  Just chop it.
    backup_bytes_ -= count;
    return true;
  }

  count -= backup_bytes_;
  backup_bytes_ = 0;

  int skipped = copying_stream_->Skip(count);
  position_ += skipped;
  return skipped == count;
}